

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O3

string * __thiscall
glcts::(anonymous_namespace)::GatherGLSLCompile::Uniforms_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "uniform mediump sampler2D tex_2d;                  \nuniform mediump isamplerCube itex_cube;            \nuniform mediump usampler2DArray utex_2da;          \nuniform mediump sampler2DShadow tex_2ds;           \nuniform mediump samplerCubeShadow tex_cubes;       \nuniform mediump sampler2DArrayShadow tex_2das;     \n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Uniforms()
	{
		return "uniform mediump sampler2D tex_2d;                  \n"
			   "uniform mediump isamplerCube itex_cube;            \n"
			   "uniform mediump usampler2DArray utex_2da;          \n"
			   ""
			   "uniform mediump sampler2DShadow tex_2ds;           \n"
			   "uniform mediump samplerCubeShadow tex_cubes;       \n"
			   "uniform mediump sampler2DArrayShadow tex_2das;     \n";
	}